

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joysticks.c
# Opt level: O0

void refresh_joysticks(void)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  float local_30;
  float local_2c;
  int button_count;
  int axis_count;
  uchar *buttons;
  float *axes;
  Joystick *j;
  int i;
  
  for (j._4_4_ = 0; j._4_4_ < 0x10; j._4_4_ = j._4_4_ + 1) {
    axes = (float *)(joysticks + (int)j._4_4_);
    iVar1 = glfwJoystickPresent(j._4_4_);
    if (iVar1 == 0) {
      if (*(char *)axes != '\0') {
        printf("Lost joystick %i named \'%s\'\n",(ulong)(j._4_4_ + 1),*(undefined8 *)(axes + 2));
        free(*(void **)(axes + 2));
        free(*(void **)(axes + 4));
        free(*(void **)(axes + 6));
        memset(axes,0,0x28);
        joystick_count = joystick_count + -1;
      }
    }
    else {
      free(*(void **)(axes + 2));
      pcVar2 = glfwGetJoystickName(j._4_4_);
      pcVar2 = strdup(pcVar2);
      *(char **)(axes + 2) = pcVar2;
      buttons = (uchar *)glfwGetJoystickAxes(j._4_4_,(int *)&local_2c);
      if (local_2c != axes[8]) {
        axes[8] = local_2c;
        pvVar3 = realloc(*(void **)(axes + 4),(long)(int)axes[8] << 2);
        *(void **)(axes + 4) = pvVar3;
      }
      memcpy(*(void **)(axes + 4),buttons,(long)(int)local_2c << 2);
      _button_count = glfwGetJoystickButtons(j._4_4_,(int *)&local_30);
      if (local_30 != axes[9]) {
        axes[9] = local_30;
        pvVar3 = realloc(*(void **)(axes + 6),(long)(int)axes[9]);
        *(void **)(axes + 6) = pvVar3;
      }
      memcpy(*(void **)(axes + 6),_button_count,(long)(int)local_30);
      if (*(char *)axes == '\0') {
        printf("Found joystick %i named \'%s\' with %i axes, %i buttons\n",(ulong)(j._4_4_ + 1),
               *(undefined8 *)(axes + 2),(ulong)(uint)axes[8],(ulong)(uint)axes[9]);
        joystick_count = joystick_count + 1;
      }
      *(undefined1 *)axes = 1;
    }
  }
  return;
}

Assistant:

static void refresh_joysticks(void)
{
    int i;

    for (i = 0;  i < sizeof(joysticks) / sizeof(Joystick);  i++)
    {
        Joystick* j = joysticks + i;

        if (glfwJoystickPresent(GLFW_JOYSTICK_1 + i))
        {
            const float* axes;
            const unsigned char* buttons;
            int axis_count, button_count;

            free(j->name);
            j->name = strdup(glfwGetJoystickName(GLFW_JOYSTICK_1 + i));

            axes = glfwGetJoystickAxes(GLFW_JOYSTICK_1 + i, &axis_count);
            if (axis_count != j->axis_count)
            {
                j->axis_count = axis_count;
                j->axes = realloc(j->axes, j->axis_count * sizeof(float));
            }

            memcpy(j->axes, axes, axis_count * sizeof(float));

            buttons = glfwGetJoystickButtons(GLFW_JOYSTICK_1 + i, &button_count);
            if (button_count != j->button_count)
            {
                j->button_count = button_count;
                j->buttons = realloc(j->buttons, j->button_count);
            }

            memcpy(j->buttons, buttons, button_count * sizeof(unsigned char));

            if (!j->present)
            {
                printf("Found joystick %i named \'%s\' with %i axes, %i buttons\n",
                       i + 1, j->name, j->axis_count, j->button_count);

                joystick_count++;
            }

            j->present = GL_TRUE;
        }
        else
        {
            if (j->present)
            {
                printf("Lost joystick %i named \'%s\'\n", i + 1, j->name);

                free(j->name);
                free(j->axes);
                free(j->buttons);
                memset(j, 0, sizeof(Joystick));

                joystick_count--;
            }
        }
    }
}